

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zel_basic_leak_checker.cpp
# Opt level: O2

ze_result_t __thiscall
validation_layer::basic_leakChecker::ZEbasic_leakChecker::zeFenceCreateEpilogue
          (ZEbasic_leakChecker *this,ze_command_queue_handle_t param_1,ze_fence_desc_t *param_2,
          ze_fence_handle_t *param_3,ze_result_t result)

{
  allocator local_39;
  string local_38;
  
  if (result == ZE_RESULT_SUCCESS) {
    std::__cxx11::string::string((string *)&local_38,"zeFenceCreate",&local_39);
    countFunctionCall(this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return result;
}

Assistant:

ze_result_t basic_leakChecker::ZEbasic_leakChecker::zeFenceCreateEpilogue(ze_command_queue_handle_t, const ze_fence_desc_t *, ze_fence_handle_t*, ze_result_t result) {
        if (result == ZE_RESULT_SUCCESS) {
            countFunctionCall("zeFenceCreate");
        }
        return result;
    }